

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O3

void __thiscall
duckdb::HashJoinGlobalSinkState::~HashJoinGlobalSinkState(HashJoinGlobalSinkState *this)

{
  _Head_base<0UL,_duckdb::JoinFilterGlobalState_*,_false> this_00;
  _Head_base<0UL,_duckdb::JoinHashTable::ProbeSpill_*,_false> __ptr;
  _Head_base<0UL,_duckdb::PerfectHashJoinExecutor_*,_false> __ptr_00;
  
  (this->super_GlobalSinkState)._vptr_GlobalSinkState =
       (_func_int **)&PTR__HashJoinGlobalSinkState_0245bb78;
  this_00._M_head_impl =
       (this->global_filter_state).
       super_unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::JoinFilterGlobalState_*,_std::default_delete<duckdb::JoinFilterGlobalState>_>
       .super__Head_base<0UL,_duckdb::JoinFilterGlobalState_*,_false>._M_head_impl;
  if (this_00._M_head_impl != (JoinFilterGlobalState *)0x0) {
    JoinFilterGlobalState::~JoinFilterGlobalState(this_00._M_head_impl);
    operator_delete(this_00._M_head_impl);
  }
  (this->global_filter_state).
  super_unique_ptr<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::JoinFilterGlobalState,_std::default_delete<duckdb::JoinFilterGlobalState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::JoinFilterGlobalState_*,_std::default_delete<duckdb::JoinFilterGlobalState>_>
  .super__Head_base<0UL,_duckdb::JoinFilterGlobalState_*,_false>._M_head_impl =
       (JoinFilterGlobalState *)0x0;
  __ptr._M_head_impl =
       (this->probe_spill).
       super_unique_ptr<duckdb::JoinHashTable::ProbeSpill,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::JoinHashTable::ProbeSpill,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::JoinHashTable::ProbeSpill_*,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>_>
       .super__Head_base<0UL,_duckdb::JoinHashTable::ProbeSpill_*,_false>._M_head_impl;
  if (__ptr._M_head_impl != (ProbeSpill *)0x0) {
    ::std::default_delete<duckdb::JoinHashTable::ProbeSpill>::operator()
              ((default_delete<duckdb::JoinHashTable::ProbeSpill> *)&this->probe_spill,
               __ptr._M_head_impl);
  }
  (this->probe_spill).
  super_unique_ptr<duckdb::JoinHashTable::ProbeSpill,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::JoinHashTable::ProbeSpill,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::JoinHashTable::ProbeSpill_*,_std::default_delete<duckdb::JoinHashTable::ProbeSpill>_>
  .super__Head_base<0UL,_duckdb::JoinHashTable::ProbeSpill_*,_false>._M_head_impl =
       (ProbeSpill *)0x0;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&this->probe_types
            );
  ::std::
  vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
  ::~vector(&(this->local_hash_tables).
             super_vector<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>_>_>
           );
  __ptr_00._M_head_impl =
       (this->perfect_join_executor).
       super_unique_ptr<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::PerfectHashJoinExecutor_*,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
       .super__Head_base<0UL,_duckdb::PerfectHashJoinExecutor_*,_false>._M_head_impl;
  if (__ptr_00._M_head_impl != (PerfectHashJoinExecutor *)0x0) {
    ::std::default_delete<duckdb::PerfectHashJoinExecutor>::operator()
              ((default_delete<duckdb::PerfectHashJoinExecutor> *)&this->perfect_join_executor,
               __ptr_00._M_head_impl);
  }
  (this->perfect_join_executor).
  super_unique_ptr<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::PerfectHashJoinExecutor,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::PerfectHashJoinExecutor_*,_std::default_delete<duckdb::PerfectHashJoinExecutor>_>
  .super__Head_base<0UL,_duckdb::PerfectHashJoinExecutor_*,_false>._M_head_impl =
       (PerfectHashJoinExecutor *)0x0;
  ::std::unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>::~unique_ptr
            (&(this->hash_table).
              super_unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>_>);
  ::std::
  unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>_>::
  ~unique_ptr(&(this->temporary_memory_state).
               super_unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>_>
             );
  ::std::vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>::~vector
            (&(this->super_GlobalSinkState).super_StateWithBlockableTasks.blocked_tasks.
              super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>);
  return;
}

Assistant:

HashJoinGlobalSinkState(const PhysicalHashJoin &op_p, ClientContext &context_p)
	    : context(context_p), op(op_p),
	      num_threads(NumericCast<idx_t>(TaskScheduler::GetScheduler(context).NumberOfThreads())),
	      temporary_memory_state(TemporaryMemoryManager::Get(context).Register(context)), finalized(false),
	      active_local_states(0), total_size(0), max_partition_size(0), max_partition_count(0),
	      probe_side_requirement(0), scanned_data(false) {
		hash_table = op.InitializeHashTable(context);

		// For perfect hash join
		perfect_join_executor = make_uniq<PerfectHashJoinExecutor>(op, *hash_table);
		bool use_perfect_hash = false;
		if (op.conditions.size() == 1 && !op.join_stats.empty() && op.join_stats[1] &&
		    TypeIsIntegral(op.join_stats[1]->GetType().InternalType()) && NumericStats::HasMinMax(*op.join_stats[1])) {
			use_perfect_hash = perfect_join_executor->CanDoPerfectHashJoin(op, NumericStats::Min(*op.join_stats[1]),
			                                                               NumericStats::Max(*op.join_stats[1]));
		}
		// For external hash join
		external = ClientConfig::GetConfig(context).GetSetting<DebugForceExternalSetting>(context);
		// Set probe types
		probe_types = op.children[0].get().GetTypes();
		probe_types.emplace_back(LogicalType::HASH);

		if (op.filter_pushdown) {
			if (op.filter_pushdown->probe_info.empty() && use_perfect_hash) {
				// Only computing min/max to check for perfect HJ, but we already can
				skip_filter_pushdown = true;
			}
			global_filter_state = op.filter_pushdown->GetGlobalState(context, op);
		}
	}